

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O1

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end,int time_now)

{
  int *piVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  if (start < end) {
    iVar8 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.motion_time +
            -0x40;
    piVar1 = &(object->super_HorizontalRun).pixel_position;
    do {
      iVar4 = end;
      if (iVar8 < end) {
        iVar4 = iVar8;
      }
      if ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving ==
          false) {
        iVar4 = end;
      }
      uVar11 = object->copy_flags;
      iVar10 = 0xa0;
      if (uVar11 != 0) {
        iVar5 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position;
        iVar10 = 0x10;
        if ((((((byte)uVar11 & iVar5 < 0x10) == 0) &&
             (iVar10 = 0x20, ((byte)uVar11 >> 1 & iVar5 < 0x20) == 0)) &&
            (iVar10 = 0xa0, iVar5 < 0x40)) && (iVar10 = 0x40, (uVar11 & 4) == 0)) {
          iVar10 = 0xa0;
        }
      }
      iVar5 = (iVar10 + start) -
              (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position;
      iVar10 = iVar4;
      if (iVar5 < iVar4) {
        iVar10 = iVar5;
      }
      uVar11 = iVar10 - start;
      if (((object->super_HorizontalRun).enqueues == true) && (time_now < iVar10)) {
        uVar6 = time_now - start;
        if ((uVar6 != 0 && start <= time_now) && (*piVar1 != 0)) {
          if ((&(object->super_HorizontalRun).field_0x1d)[object->enabled_index] == '\x01') {
            if (0 < (int)uVar6) {
              lVar9 = 200;
              do {
                pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar9 + start);
                *pbVar2 = *pbVar2 | collision_identity;
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) break;
                uVar3 = lVar9 - 199;
                lVar9 = lVar9 + 1;
              } while (uVar3 < uVar6);
            }
          }
          else {
            iVar7 = *piVar1 - uVar6;
LAB_003013f9:
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            *piVar1 = iVar7;
          }
        }
      }
      else if (*piVar1 != 0) {
        if ((&(object->super_HorizontalRun).field_0x1d)[object->enabled_index] != '\x01') {
          iVar7 = *piVar1 - uVar11;
          goto LAB_003013f9;
        }
        if (0 < (int)uVar11) {
          lVar9 = 200;
          do {
            pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar9 + start);
            *pbVar2 = *pbVar2 | collision_identity;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) break;
            uVar3 = lVar9 - 199;
            lVar9 = lVar9 + 1;
          } while (uVar3 < uVar11);
        }
      }
      (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position =
           (int)(uVar11 + (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.
                          position) % 0xa0;
      if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving ==
           true) && (iVar10 == iVar8)) {
        perform_motion_step<Atari2600::TIA::Ball>(this,object);
        iVar8 = iVar8 + 4;
      }
      else if (iVar5 <= iVar4) {
        (object->super_HorizontalRun).pixel_position = (object->super_HorizontalRun).size;
      }
      start = iVar10;
    } while (iVar10 < end);
  }
  return;
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}